

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

void __thiscall XmlRpc::XmlRpcValue::assertType(XmlRpcValue *this,Type t)

{
  string *psVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_type == t) {
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"type error","");
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
  *(undefined4 *)(psVar1 + 0x20) = 0xffffffff;
  __cxa_throw(psVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
}

Assistant:

void XmlRpcValue::assertType(Type t) const
  {
    if (_type != t)
      throw XmlRpcException("type error");
  }